

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_clip_bary2(REF_DBL *orig_bary,REF_DBL *bary)

{
  undefined8 uVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = 0.0;
  if (0.0 <= *orig_bary) {
    dVar5 = *orig_bary;
  }
  *bary = dVar5;
  dVar4 = 0.0;
  if (0.0 <= orig_bary[1]) {
    dVar4 = orig_bary[1];
  }
  bary[1] = dVar4;
  dVar3 = dVar5 + dVar4;
  dVar6 = dVar3 * 1e+20;
  if (dVar6 <= -dVar6) {
    dVar6 = -dVar6;
  }
  dVar7 = dVar5;
  if (dVar5 <= -dVar5) {
    dVar7 = -dVar5;
  }
  if (dVar7 < dVar6) {
    dVar7 = dVar4;
    if (dVar4 <= -dVar4) {
      dVar7 = -dVar4;
    }
    if (dVar7 < dVar6) {
      *bary = dVar5 / dVar3;
      bary[1] = dVar4 / dVar3;
      if (0.0 <= dVar5 / dVar3) {
        if (0.0 <= dVar4 / dVar3) {
          return 0;
        }
        pcVar2 = "bary[1] not positive";
        uVar1 = 0xbf6;
      }
      else {
        pcVar2 = "bary[0] not positive";
        uVar1 = 0xbf5;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar1,
             "ref_node_clip_bary2",pcVar2);
      return 1;
    }
  }
  printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n",dVar3,*orig_bary,orig_bary[1],
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xbe9,
         "ref_node_clip_bary2");
  printf("clipped bary\n%.18e %.18e\n",*bary,bary[1]);
  dVar5 = bary[1];
  dVar4 = *bary;
  dVar6 = *bary;
  *bary = 0.0;
  bary[1] = 0.0;
  bary[dVar6 <= dVar5 && dVar5 != dVar4] = 1.0;
  printf("modified bary\n%.18e %.18e\n",*bary,bary[1]);
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary2(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);

  total = bary[0] + bary[1];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total)) {
    bary[0] /= total;
    bary[1] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n", __FILE__,
           __LINE__, __func__, total, orig_bary[0], orig_bary[1]);
    printf("clipped bary\n%.18e %.18e\n", bary[0], bary[1]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 2; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 2; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e\n", bary[0], bary[1]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");

  return REF_SUCCESS;
}